

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
KillBotsIRCCommand::trigger
          (KillBotsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  Server *pSVar1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *this_00;
  Channel *pCVar2;
  char *pcVar3;
  bool bVar4;
  reference ppSVar5;
  char *pcVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  size_t local_e8;
  char *local_e0;
  size_t local_d8;
  char *local_d0;
  Server **server;
  const_iterator __end1;
  const_iterator __begin1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *__range1;
  size_t local_98;
  char *local_90;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> local_70 [24];
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_58;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *servers;
  char *local_48;
  long local_40;
  Channel *chan;
  IRC_Bot *source_local;
  KillBotsIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (KillBotsIRCCommand *)nick._M_len;
  pcVar6 = channel._M_str;
  servers = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)channel._M_len;
  local_48 = pcVar6;
  chan = (Channel *)source;
  source_local = (IRC_Bot *)this;
  nick_local._M_str = (char *)servers;
  local_40 = Jupiter::IRC::Client::getChannel(source,servers,pcVar6);
  if (local_40 != 0) {
    RenX::getCore();
    Jupiter::IRC::Client::Channel::getType();
    RenX::Core::getServers((int)local_70);
    local_58 = local_70;
    bVar4 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::empty(local_58);
    pcVar3 = nick_local._M_str;
    pCVar2 = chan;
    this_00 = local_58;
    if (bVar4) {
      bVar7 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
      local_98 = bVar7._M_len;
      local_90 = bVar7._M_str;
      Jupiter::IRC::Client::sendMessage(pCVar2,pcVar3,pcVar6,local_98,local_90);
    }
    else {
      __end1 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::begin(local_58);
      server = (Server **)std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::end(this_00)
      ;
      while (bVar4 = __gnu_cxx::
                     operator==<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                               (&__end1,(__normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                         *)&server), ((bVar4 ^ 0xffU) & 1) != 0) {
        ppSVar5 = __gnu_cxx::
                  __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                  ::operator*(&__end1);
        pSVar1 = *ppSVar5;
        bVar7 = sv("killbots",8);
        local_d8 = bVar7._M_len;
        local_d0 = bVar7._M_str;
        RenX::Server::send(pSVar1,local_d8,local_d0);
        pSVar1 = *ppSVar5;
        bVar7 = sv("All bots have been removed from the server.",0x2b);
        local_e8 = bVar7._M_len;
        local_e0 = bVar7._M_str;
        RenX::Server::sendMessage(pSVar1,local_e8,local_e0);
        __gnu_cxx::
        __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
        ::operator++(&__end1);
      }
    }
    std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector(local_70);
  }
  return;
}

Assistant:

void KillBotsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	for (const auto& server : servers) {
		server->send("killbots"sv);
		server->sendMessage("All bots have been removed from the server."sv);
	}
}